

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
::internal_emplace<int_const&>
          (btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
           *this,iterator iter,int *args)

{
  bool bVar1;
  byte bVar2;
  btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar3;
  int *piVar4;
  btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar5;
  node_type *pnVar6;
  allocator_type *paVar7;
  node_type **ppnVar8;
  size_type i;
  iterator iVar9;
  int local_44 [3];
  int *piStack_38;
  int max_count;
  int *args_local;
  btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *this_local;
  iterator iter_local;
  
  this_local = (btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                *)iter.node;
  iter_local.node._0_4_ = iter.position;
  piStack_38 = args;
  args_local = (int *)this;
  bVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::leaf((btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  *)this_local);
  if (!bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
    ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                  *)&this_local);
    iter_local.node._0_4_ = (int)iter_local.node + 1;
  }
  bVar2 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::max_count((btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       *)this_local);
  local_44[2] = (int)bVar2;
  bVar2 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::count((btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   *)this_local);
  pbVar5 = this_local;
  if ((uint)bVar2 == local_44[2]) {
    if (local_44[2] < 0x3d) {
      pbVar3 = (btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                *)btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  ::root((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                          *)this);
      if (pbVar5 != pbVar3) {
        __assert_fail("iter.node == root()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xc27,
                      "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>, Args = <const int &>]"
                     );
      }
      local_44[1] = 0x3d;
      local_44[0] = local_44[2] << 1;
      piVar4 = std::min<int>(local_44 + 1,local_44);
      pbVar5 = (btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                *)btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  ::new_leaf_root_node
                            ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                              *)this,*piVar4);
      this_local = pbVar5;
      pnVar6 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               ::root((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       *)this);
      paVar7 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               ::mutable_allocator((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                                    *)this);
      btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::swap((btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              *)pbVar5,pnVar6,paVar7);
      pnVar6 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               ::root((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       *)this);
      btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::delete_leaf_node((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                          *)this,pnVar6);
      pbVar5 = this_local;
      ppnVar8 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::mutable_root((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                                *)this);
      *ppnVar8 = (node_type *)pbVar5;
      *(btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
        **)(this + 8) = this_local;
    }
    else {
      btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
      ::rebalance_or_split
                ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                  *)this,(iterator *)&this_local);
    }
  }
  pbVar5 = this_local;
  i = (size_type)(int)iter_local.node;
  paVar7 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
           ::mutable_allocator((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                                *)this);
  btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
  ::emplace_value<int_const&>
            ((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
              *)pbVar5,i,paVar7,piStack_38);
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  iVar9.position = (int)iter_local.node;
  iVar9.node = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                *)this_local;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }